

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O1

void __thiscall
HoldingProperty_CopyOwner_Test::~HoldingProperty_CopyOwner_Test
          (HoldingProperty_CopyOwner_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HoldingProperty, CopyOwner)
{
  BasicHoldingProperties obj_orig;
  obj_orig.int_value = 5;
  obj_orig.setROIntValue( 6 );
  obj_orig.string_value = "bob";
  obj_orig.setROStringValue( "bill" );
  
  BasicHoldingProperties obj{ obj_orig };
  EXPECT_EQ( 5, obj.int_value() );
  EXPECT_EQ( 6, obj.ro_int_value() );
  EXPECT_EQ( "bob", obj.string_value() );
  EXPECT_EQ( "bill", obj.ro_string_value() );
  
  BasicHoldingProperties obj2;
  obj2.int_value = 0;
  obj2.string_value = "";
  obj2 = obj_orig;
  EXPECT_EQ( 5, obj2.int_value() );
  EXPECT_EQ( 6, obj2.ro_int_value() );
  EXPECT_EQ( "bob", obj2.string_value() );
  EXPECT_EQ( "bill", obj2.ro_string_value() );
}